

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O1

int __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *enterTest,bool polish)

{
  undefined1 *this_00;
  uint *puVar1;
  double dVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar4;
  int *idx;
  pointer pBVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer pnVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar18;
  BreakpointSource BVar19;
  BreakpointSource BVar20;
  cpp_dec_float<50U,_int,_void> *pcVar21;
  type_conflict5 tVar22;
  bool bVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar27;
  long lVar28;
  pointer pnVar29;
  cpp_dec_float<50U,_int,_void> *u;
  uint uVar30;
  ulong uVar31;
  uint local_648;
  int local_644;
  int nBp;
  int leaveIdx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int minIdx;
  pointer local_5a8;
  pointer local_5a0;
  cpp_dec_float<50U,_int,_void> *local_598;
  pointer local_590;
  pointer local_588;
  int32_t local_580;
  fpclass_type local_57c;
  cpp_dec_float<50U,_int,_void> local_578;
  cpp_dec_float<50U,_int,_void> local_538;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4f8;
  cpp_dec_float<50U,_int,_void> *local_4f0;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4e8;
  BreakpointCompare compare;
  undefined1 local_4d8 [16];
  uint local_4c8 [3];
  undefined3 uStack_4bb;
  uint local_4b8;
  undefined3 uStack_4b3;
  int local_4b0;
  bool local_4ac;
  undefined8 local_4a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  SPxId baseId;
  cpp_dec_float<50U,_int,_void> local_458;
  uint local_418 [10];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_348;
  undefined8 local_308;
  undefined8 uStack_300;
  uint local_2f8 [2];
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  uint local_218 [2];
  uint auStack_210 [2];
  uint local_208 [2];
  uint auStack_200 [2];
  uint local_1f8 [4];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar24 = ((this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver)->enterCount;
  if ((iVar24 * -0x3d70a3d7 + 0x51eb850U >> 2 | iVar24 * 0x40000000) < 0x28f5c29) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)
               &(this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).field_0x114,1);
  }
  if ((((polish) ||
       ((this->
        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).field_0x111 != '\x01')) ||
      ((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).field_0x112 != '\x01')) ||
     (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .thesolver)->theRep == COLUMN)) {
LAB_002df236:
    local_68.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((enterTest->m_backend).data._M_elems + 8);
    pnVar27 = &local_68;
    local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterTest->m_backend).data._M_elems;
    local_68.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((enterTest->m_backend).data._M_elems + 2);
    local_68.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((enterTest->m_backend).data._M_elems + 4);
    local_68.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((enterTest->m_backend).data._M_elems + 6);
    local_68.m_backend.exp = (enterTest->m_backend).exp;
    local_68.m_backend.neg = (enterTest->m_backend).neg;
    local_68.m_backend.fpclass = (enterTest->m_backend).fpclass;
    local_68.m_backend.prec_elem = (enterTest->m_backend).prec_elem;
    goto LAB_002df278;
  }
  this_00 = &(this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).field_0x114;
  if (*(int *)&this->field_0x144 != 2) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       ((cpp_dec_float<50U,_int,_void> *)this_00,&lowstab.m_backend);
    if (iVar24 < 1) goto LAB_002df236;
  }
  pSVar3 = (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver;
  pUVar4 = pSVar3->theFvec;
  local_588 = (pUVar4->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_5a0 = (pUVar4->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  idx = (pUVar4->thedelta).super_IdxSet.idx;
  local_644 = (pUVar4->thedelta).super_IdxSet.num;
  local_590 = (pSVar3->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_5a8 = (pSVar3->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_538.fpclass = cpp_dec_float_finite;
  local_538.prec_elem = 10;
  local_538.data._M_elems[0] = 0;
  local_538.data._M_elems[1] = 0;
  local_538.data._M_elems[2] = 0;
  local_538.data._M_elems[3] = 0;
  local_538.data._M_elems[4] = 0;
  local_538.data._M_elems[5] = 0;
  local_538.data._M_elems[6] = 0;
  local_538.data._M_elems[7] = 0;
  local_538.data._M_elems[8] = 0;
  local_538.data._M_elems[9] = 0;
  local_538.exp = 0;
  local_538.neg = false;
  leaveIdx = -1;
  local_458.fpclass = cpp_dec_float_finite;
  local_458.prec_elem = 10;
  local_458.data._M_elems[0] = 0;
  local_458.data._M_elems[1] = 0;
  local_458.data._M_elems[2] = 0;
  local_458.data._M_elems[3] = 0;
  local_458.data._M_elems[4] = 0;
  local_458.data._M_elems[5] = 0;
  local_458.data._M_elems[6] = 0;
  local_458.data._M_elems[7] = 0;
  local_458.data._M_elems[8] = 0;
  local_458.data._M_elems[9] = 0;
  local_458.exp = 0;
  local_458.neg = false;
  local_418[8] = 0;
  local_418[9] = 0;
  local_418[4] = 0;
  local_418[5] = 0;
  local_418[6] = 0;
  local_418[7] = 0;
  local_418[0] = 0;
  local_418[1] = 0;
  local_418[2] = 0;
  local_418[3] = 0;
  local_348.fpclass = cpp_dec_float_finite;
  local_348.prec_elem = 10;
  local_348.data._M_elems[0] = 0;
  local_348.data._M_elems[1] = 0;
  local_348.data._M_elems[2] = 0;
  local_348.data._M_elems[3] = 0;
  local_348.data._M_elems[4] = 0;
  local_348.data._M_elems[5] = 0;
  local_348.data._M_elems._24_5_ = 0;
  local_348.data._M_elems[7]._1_3_ = 0;
  local_348.data._M_elems._32_5_ = 0;
  local_348.data._M_elems[9]._1_3_ = 0;
  local_348.exp = 0;
  local_348.neg = false;
  local_578.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_578.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_578.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_578.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_578.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_578.exp = (val->m_backend).exp;
  local_578.neg = (val->m_backend).neg;
  local_578.fpclass = (val->m_backend).fpclass;
  local_578.prec_elem = (val->m_backend).prec_elem;
  local_4f0 = (cpp_dec_float<50U,_int,_void> *)this_00;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)val,0.0);
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_538,0.0);
  nBp = 0;
  minIdx = -1;
  if (local_578.fpclass == cpp_dec_float_NaN) {
LAB_002df4b7:
    collectBreakpointsMin
              (this,&nBp,&minIdx,idx,local_644,local_5a0,local_588,local_590,local_5a8,FVEC);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_578,&lowstab.m_backend);
    if (iVar24 < 1) goto LAB_002df4b7;
    collectBreakpointsMax
              (this,&nBp,&minIdx,idx,local_644,local_5a0,local_588,local_590,local_5a8,FVEC);
  }
  if (nBp == 0) {
    *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_578.data._M_elems._32_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_578.data._M_elems._16_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_578.data._M_elems._24_8_;
    *(undefined8 *)(val->m_backend).data._M_elems = local_578.data._M_elems._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_578.data._M_elems._8_8_;
    (val->m_backend).exp = local_578.exp;
    (val->m_backend).neg = local_578.neg;
    (val->m_backend).fpclass = local_578.fpclass;
    (val->m_backend).prec_elem = local_578.prec_elem;
    return leaveIdx;
  }
  lVar26 = (long)minIdx;
  pBVar5 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 0x20);
  uVar12 = *(undefined8 *)&pBVar5[lVar26].val;
  uVar13 = *(undefined8 *)((long)&pBVar5[lVar26].val + 8);
  uVar14 = *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 0x10);
  uVar15 = *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 0x18);
  iVar24 = *(int *)((long)&pBVar5[lVar26].val.m_backend + 0x28);
  bVar23 = *(bool *)((long)&pBVar5[lVar26].val.m_backend + 0x2c);
  iVar25 = pBVar5[lVar26].idx;
  BVar20 = pBVar5[lVar26].src;
  *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 0x20) =
       *(undefined8 *)((long)&(pBVar5->val).m_backend + 0x20);
  uVar7 = *(undefined8 *)((long)&(pBVar5->val).m_backend + 8);
  uVar8 = *(undefined8 *)((long)&(pBVar5->val).m_backend + 0x10);
  uVar16 = *(undefined8 *)((long)&(pBVar5->val).m_backend + 0x18);
  *(undefined8 *)&pBVar5[lVar26].val = *(undefined8 *)&(pBVar5->val).m_backend;
  *(undefined8 *)((long)&pBVar5[lVar26].val + 8) = uVar7;
  *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 0x10) = uVar8;
  *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 0x18) = uVar16;
  *(int *)((long)&pBVar5[lVar26].val.m_backend + 0x28) =
       *(int *)((long)&(pBVar5->val).m_backend + 0x28);
  *(bool *)((long)&pBVar5[lVar26].val.m_backend + 0x2c) =
       *(bool *)((long)&(pBVar5->val).m_backend + 0x2c);
  uVar7 = *(undefined8 *)((long)&(pBVar5->val).m_backend + 0x30);
  BVar19 = pBVar5->src;
  pBVar5[lVar26].idx = pBVar5->idx;
  pBVar5[lVar26].src = BVar19;
  uVar8 = *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 0x30);
  *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 0x30) = uVar7;
  pBVar5 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)&(pBVar5->val).m_backend + 0x20) = uVar6;
  *(undefined8 *)((long)&(pBVar5->val).m_backend + 0x10) = uVar14;
  *(undefined8 *)((long)&(pBVar5->val).m_backend + 0x18) = uVar15;
  *(undefined8 *)&(pBVar5->val).m_backend = uVar12;
  *(undefined8 *)((long)&(pBVar5->val).m_backend + 8) = uVar13;
  *(int *)((long)&(pBVar5->val).m_backend + 0x28) = iVar24;
  *(bool *)((long)&(pBVar5->val).m_backend + 0x2c) = bVar23;
  *(undefined8 *)((long)&(pBVar5->val).m_backend + 0x30) = uVar8;
  pBVar5->idx = iVar25;
  pBVar5->src = BVar20;
  local_458.data._M_elems[0] = (enterTest->m_backend).data._M_elems[0];
  local_458.exp = (enterTest->m_backend).exp;
  local_458.neg = (enterTest->m_backend).neg;
  local_458.fpclass = (enterTest->m_backend).fpclass;
  local_458.prec_elem = (enterTest->m_backend).prec_elem;
  if (local_458.neg == true) {
    local_458.neg = local_458.fpclass == cpp_dec_float_finite && local_458.data._M_elems[0] == 0;
  }
  uVar6 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 1);
  uVar7 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 3);
  uVar8 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 5);
  uVar12 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 7);
  local_458.data._M_elems[1] = (uint)uVar6;
  local_458.data._M_elems[2] = (uint)((ulong)uVar6 >> 0x20);
  local_458.data._M_elems[3] = (uint)uVar7;
  local_458.data._M_elems[4] = (uint)((ulong)uVar7 >> 0x20);
  local_458.data._M_elems[5] = (uint)uVar8;
  local_458.data._M_elems[6] = (uint)((ulong)uVar8 >> 0x20);
  local_458.data._M_elems[7] = (uint)uVar12;
  local_458.data._M_elems[8] = (uint)((ulong)uVar12 >> 0x20);
  local_458.data._M_elems[9] = (enterTest->m_backend).data._M_elems[9];
  auVar17._12_4_ = 0;
  auVar17._0_4_ = lowstab.m_backend.data._M_elems[1];
  auVar17._4_4_ = lowstab.m_backend.data._M_elems[2];
  auVar17._8_4_ = lowstab.m_backend.data._M_elems[3];
  lowstab.m_backend.data._M_elems._0_16_ = auVar17 << 0x20;
  tVar22 = boost::multiprecision::operator==
                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_458,(int *)&lowstab);
  if (tVar22) {
    pSVar3 = (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver;
    uVar6 = *(undefined8 *)((pSVar3->instableEnterVal).m_backend.data._M_elems + 8);
    local_458.data._M_elems[8] = (uint)uVar6;
    local_458.data._M_elems[9] = (uint)((ulong)uVar6 >> 0x20);
    uVar6 = *(undefined8 *)(pSVar3->instableEnterVal).m_backend.data._M_elems;
    uVar7 = *(undefined8 *)((pSVar3->instableEnterVal).m_backend.data._M_elems + 2);
    uVar8 = *(undefined8 *)((pSVar3->instableEnterVal).m_backend.data._M_elems + 4);
    uVar12 = *(undefined8 *)((pSVar3->instableEnterVal).m_backend.data._M_elems + 6);
    local_458.data._M_elems[4] = (uint)uVar8;
    local_458.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
    local_458.data._M_elems[6] = (uint)uVar12;
    local_458.data._M_elems[7] = (uint)((ulong)uVar12 >> 0x20);
    local_458.data._M_elems[0] = (uint)uVar6;
    local_458.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
    local_458.data._M_elems[2] = (uint)uVar7;
    local_458.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
    local_458.exp = (pSVar3->instableEnterVal).m_backend.exp;
    local_458.neg = (pSVar3->instableEnterVal).m_backend.neg;
    local_458.fpclass = (pSVar3->instableEnterVal).m_backend.fpclass;
    local_458.prec_elem = (pSVar3->instableEnterVal).m_backend.prec_elem;
  }
  compare.entry =
       (this->breakpoints).data.
       super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_648 = 0;
  local_644 = 0;
  local_4e8 = this;
  if ((0 < nBp) && (local_458.fpclass != cpp_dec_float_NaN)) {
    local_644 = 0;
    local_3f0 = enterTest;
    while( true ) {
      enterTest = local_3f0;
      this = local_4e8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&lowstab.m_backend,0,(type *)0x0);
      iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_458,&lowstab.m_backend);
      if (iVar24 < 1) break;
      if (local_644 < (int)local_648) {
        local_644 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                              ((this->breakpoints).data.
                               super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                               ._M_impl.super__Vector_impl_data._M_start,&compare,local_644 + 1,nBp,
                               4,0,0,true);
      }
      iVar24 = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)local_648].idx;
      _local_4b8 = 0;
      uStack_4b3 = 0;
      local_4c8[0] = 0;
      local_4c8[1] = 0;
      stack0xfffffffffffffb40 = 0;
      uStack_4bb = 0;
      local_4d8 = (undefined1  [16])0x0;
      pnVar27 = local_5a0 + iVar24;
      local_308 = *(undefined8 *)(pnVar27->m_backend).data._M_elems;
      uStack_300 = *(undefined8 *)((pnVar27->m_backend).data._M_elems + 2);
      puVar1 = local_5a0[iVar24].m_backend.data._M_elems + 4;
      lowstab.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uStack_2f0 = *(undefined8 *)(puVar1 + 2);
      local_2e8 = *(undefined8 *)(local_5a0[iVar24].m_backend.data._M_elems + 8);
      lowstab.m_backend.exp = local_5a0[iVar24].m_backend.exp;
      lowstab.m_backend.neg = local_5a0[iVar24].m_backend.neg;
      lowstab.m_backend.fpclass = local_5a0[iVar24].m_backend.fpclass;
      lowstab.m_backend.prec_elem = local_5a0[iVar24].m_backend.prec_elem;
      lowstab.m_backend.data._M_elems._32_5_ = SUB85(local_2e8,0);
      lowstab.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_2e8 >> 0x28);
      lowstab.m_backend.data._M_elems._24_5_ = SUB85(uStack_2f0,0);
      lowstab.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_2f0 >> 0x28);
      if ((lowstab.m_backend.neg == true) &&
         (lowstab.m_backend.data._M_elems[0] = (uint)local_308,
         lowstab.m_backend.fpclass != cpp_dec_float_finite ||
         lowstab.m_backend.data._M_elems[0] != 0)) {
        lowstab.m_backend.neg = false;
      }
      pSVar3 = (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .thesolver;
      baseId.super_DataKey =
           (pSVar3->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).theBaseId.data[iVar24].super_DataKey;
      lowstab.m_backend.data._M_elems._0_16_ =
           *(undefined1 (*) [16])(pnVar27->m_backend).data._M_elems;
      local_2f8 = (uint  [2])lowstab.m_backend.data._M_elems._16_8_;
      iVar24 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::number(&pSVar3->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ,&baseId);
      pSVar3 = (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .thesolver;
      pLVar18 = &(pSVar3->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      if (0 < baseId.super_DataKey.info) {
        pLVar18 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&(pSVar3->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
      }
      pnVar9 = (pLVar18->right).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar29 = pnVar9 + iVar24;
      result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar29->m_backend).data._M_elems;
      result.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)(pnVar29->m_backend).data._M_elems + 8);
      local_4d8 = *(undefined1 (*) [16])&(pnVar29->m_backend).data;
      puVar1 = (uint *)((long)&pnVar9[iVar24].m_backend.data + 0x10);
      result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      stack0xfffffffffffffb40 = result.m_backend.data._M_elems._24_5_;
      uStack_4bb = result.m_backend.data._M_elems[7]._1_3_;
      result.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&pnVar9[iVar24].m_backend.data + 0x20);
      _local_4b8 = result.m_backend.data._M_elems._32_5_;
      uStack_4b3 = result.m_backend.data._M_elems[9]._1_3_;
      result.m_backend.exp = pnVar9[iVar24].m_backend.exp;
      pLVar18 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&(pSVar3->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      if (baseId.super_DataKey.info < 1) {
        pLVar18 = &(pSVar3->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
      }
      result.m_backend.neg = pnVar9[iVar24].m_backend.neg;
      pnVar29 = (pLVar18->left).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      result.m_backend.fpclass = pnVar9[iVar24].m_backend.fpclass;
      result.m_backend.prec_elem = pnVar9[iVar24].m_backend.prec_elem;
      uVar8 = *(undefined8 *)&pnVar29[iVar24].m_backend.data;
      uVar12 = *(undefined8 *)((long)&pnVar29[iVar24].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar29[iVar24].m_backend.data + 0x10);
      uVar13 = *(undefined8 *)puVar1;
      uVar14 = *(undefined8 *)(puVar1 + 2);
      uVar6 = *(undefined8 *)((long)&pnVar29[iVar24].m_backend.data + 0x20);
      iVar25 = pnVar29[iVar24].m_backend.exp;
      bVar23 = pnVar29[iVar24].m_backend.neg;
      uVar7._0_4_ = pnVar29[iVar24].m_backend.fpclass;
      uVar7._4_4_ = pnVar29[iVar24].m_backend.prec_elem;
      local_4c8._0_8_ = result.m_backend.data._M_elems._16_8_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result.m_backend,&lowstab.m_backend);
      result_1.m_backend.data._M_elems[8] = (uint)uVar6;
      result_1.m_backend.data._M_elems[9] = (uint)((ulong)uVar6 >> 0x20);
      result_1.m_backend.data._M_elems[4] = (uint)uVar13;
      result_1.m_backend.data._M_elems[5] = (uint)((ulong)uVar13 >> 0x20);
      result_1.m_backend.data._M_elems[6] = (uint)uVar14;
      result_1.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
      result_1.m_backend.data._M_elems[0] = (uint)uVar8;
      result_1.m_backend.data._M_elems[1] = (uint)((ulong)uVar8 >> 0x20);
      result_1.m_backend.data._M_elems[2] = (uint)uVar12;
      result_1.m_backend.data._M_elems[3] = (uint)((ulong)uVar12 >> 0x20);
      result_1.m_backend.exp = iVar25;
      result_1.m_backend.neg = bVar23;
      result_1.m_backend._48_8_ = uVar7;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result_1.m_backend,&lowstab.m_backend);
      result_2.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
      result_2.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
      result_2.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      result_2.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      result_2.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
      result_2.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
      result_2.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      result_2.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      result_2.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      result_2.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      result_2.m_backend.exp = result.m_backend.exp;
      result_2.m_backend.neg = result.m_backend.neg;
      result_2.m_backend.fpclass = result.m_backend.fpclass;
      result_2.m_backend.prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&result_2.m_backend,&result_1.m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_458,&result_2.m_backend);
      if (((lowstab.m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_538.fpclass != cpp_dec_float_NaN)) &&
         (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&lowstab.m_backend,&local_538), 0 < iVar24)) {
        local_538.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
        local_538.data._M_elems[9] =
             (uint)(CONCAT35(lowstab.m_backend.data._M_elems[9]._1_3_,
                             lowstab.m_backend.data._M_elems._32_5_) >> 0x20);
        local_538.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
        local_538.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
        local_538.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
        local_538.data._M_elems[7] =
             (uint)(CONCAT35(lowstab.m_backend.data._M_elems[7]._1_3_,
                             lowstab.m_backend.data._M_elems._24_5_) >> 0x20);
        local_538.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
        local_538.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
        local_538.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
        local_538.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
        local_538.exp = lowstab.m_backend.exp;
        local_538.neg = lowstab.m_backend.neg;
        local_538.fpclass = lowstab.m_backend.fpclass;
        local_538.prec_elem = lowstab.m_backend.prec_elem;
      }
      local_648 = local_648 + 1;
      this = local_4e8;
      enterTest = local_3f0;
      if ((nBp <= (int)local_648) || (local_458.fpclass == cpp_dec_float_NaN)) break;
    }
  }
  local_648 = local_648 - 1;
  pnVar27 = &(this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .delta;
  if (((local_458.fpclass != cpp_dec_float_NaN) &&
      (((this->
        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .delta.m_backend.fpclass != cpp_dec_float_NaN &&
       (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_458,&pnVar27->m_backend), 0 < iVar24)))) &&
     (nBp + -1 <= (int)local_648)) {
    lowstab.m_backend.data._M_elems[0] = 0;
    lowstab.m_backend.data._M_elems[1] = 0x3fe00000;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
    ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  *)local_4f0,(double *)&lowstab);
    *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_578.data._M_elems._32_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_578.data._M_elems._16_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_578.data._M_elems._24_8_;
    *(undefined8 *)(val->m_backend).data._M_elems = local_578.data._M_elems._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_578.data._M_elems._8_8_;
    (val->m_backend).exp = local_578.exp;
    (val->m_backend).neg = local_578.neg;
    (val->m_backend).fpclass = local_578.fpclass;
    (val->m_backend).prec_elem = local_578.prec_elem;
    local_a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((enterTest->m_backend).data._M_elems + 8);
    pnVar27 = &local_a8;
    local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterTest->m_backend).data._M_elems;
    local_a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((enterTest->m_backend).data._M_elems + 2);
    local_a8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((enterTest->m_backend).data._M_elems + 4);
    local_a8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((enterTest->m_backend).data._M_elems + 6);
    local_a8.m_backend.exp = (enterTest->m_backend).exp;
    local_a8.m_backend.neg = (enterTest->m_backend).neg;
    local_a8.m_backend.fpclass = (enterTest->m_backend).fpclass;
    local_a8.m_backend.prec_elem = (enterTest->m_backend).prec_elem;
    polish = false;
LAB_002df278:
    iVar24 = SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::selectLeave(&this->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ,val,pnVar27,polish);
    return iVar24;
  }
  lVar26 = (long)(int)local_648;
  pBVar5 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  result_2.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pBVar5[lVar26].val.m_backend;
  result_2.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 8);
  puVar1 = (uint *)((long)&pBVar5[lVar26].val.m_backend + 0x10);
  result_2.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  result_2.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  result_2.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 0x20);
  result_2.m_backend.exp = *(int *)((long)&pBVar5[lVar26].val.m_backend + 0x28);
  result_2.m_backend.neg = *(bool *)((long)&pBVar5[lVar26].val.m_backend + 0x2c);
  result_2.m_backend._48_8_ = *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 0x30);
  lVar28 = lVar26 * 0x40 + 0x78;
  local_598 = (cpp_dec_float<50U,_int,_void> *)CONCAT44(local_598._4_4_,0xffffffff);
  uVar30 = local_648;
  local_4f8 = pnVar27;
  do {
    uVar30 = uVar30 + 1;
    if ((long)nBp <= lVar26 + 1) break;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&result.m_backend,0,(type *)0x0);
    if (local_644 <= lVar26) {
      local_644 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                            ((this->breakpoints).data.
                             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                             ._M_impl.super__Vector_impl_data._M_start,&compare,local_644 + 1,nBp,4,
                             0,0,true);
    }
    iVar24 = *(int *)((long)&(((this->breakpoints).data.
                               super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                               ._M_impl.super__Vector_impl_data._M_start)->val).m_backend + lVar28);
    uVar6 = *(undefined8 *)(local_5a0[iVar24].m_backend.data._M_elems + 8);
    result_1.m_backend.data._M_elems[8] = (uint)uVar6;
    result_1.m_backend.data._M_elems[9] = (uint)((ulong)uVar6 >> 0x20);
    pnVar27 = local_5a0 + iVar24;
    uVar7 = *(undefined8 *)(pnVar27->m_backend).data._M_elems;
    uVar8 = *(undefined8 *)((pnVar27->m_backend).data._M_elems + 2);
    lowstab.m_backend.data._M_elems._0_16_ =
         *(undefined1 (*) [16])(pnVar27->m_backend).data._M_elems;
    puVar1 = local_5a0[iVar24].m_backend.data._M_elems + 4;
    lowstab.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar12 = *(undefined8 *)(puVar1 + 2);
    result_1.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
    result_1.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
    result_1.m_backend.data._M_elems[6] = (uint)uVar12;
    result_1.m_backend.data._M_elems[7] = (uint)((ulong)uVar12 >> 0x20);
    result_1.m_backend.data._M_elems[0] = (uint)uVar7;
    result_1.m_backend.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
    result_1.m_backend.data._M_elems[2] = (uint)uVar8;
    result_1.m_backend.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
    lowstab.m_backend.exp = local_5a0[iVar24].m_backend.exp;
    result_1.m_backend.neg = local_5a0[iVar24].m_backend.neg;
    result_1.m_backend.fpclass = local_5a0[iVar24].m_backend.fpclass;
    result_1.m_backend.prec_elem = local_5a0[iVar24].m_backend.prec_elem;
    lowstab.m_backend.data._M_elems._32_5_ = SUB85(uVar6,0);
    lowstab.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    lowstab.m_backend.data._M_elems._24_5_ = SUB85(uVar12,0);
    lowstab.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
    lowstab.m_backend.prec_elem = result_1.m_backend.prec_elem;
    lowstab.m_backend.fpclass = result_1.m_backend.fpclass;
    lowstab.m_backend.neg = result_1.m_backend.neg;
    if ((result_1.m_backend.neg == true) &&
       (result_1.m_backend.data._M_elems[0] != 0 ||
        result_1.m_backend.fpclass != cpp_dec_float_finite)) {
      lowstab.m_backend.neg = false;
    }
    result_1.m_backend.exp = lowstab.m_backend.exp;
    if (((result_1.m_backend.fpclass == cpp_dec_float_NaN) ||
        (local_538.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&lowstab.m_backend,&local_538), iVar25 < 1)) {
      lowstab.m_backend.fpclass = cpp_dec_float_finite;
      lowstab.m_backend.prec_elem = 10;
      lowstab.m_backend.data._M_elems[0] = 0;
      lowstab.m_backend.data._M_elems[1] = 0;
      lowstab.m_backend.data._M_elems[2] = 0;
      lowstab.m_backend.data._M_elems[3] = 0;
      lowstab.m_backend.data._M_elems[4] = 0;
      lowstab.m_backend.data._M_elems[5] = 0;
      lowstab.m_backend.data._M_elems._24_5_ = 0;
      lowstab.m_backend.data._M_elems[7]._1_3_ = 0;
      lowstab.m_backend.data._M_elems._32_5_ = 0;
      lowstab.m_backend.data._M_elems[9]._1_3_ = 0;
      lowstab.m_backend.exp = 0;
      lowstab.m_backend.neg = false;
      if (&lowstab != local_4f8) {
        uVar6 = *(undefined8 *)((local_4f8->m_backend).data._M_elems + 8);
        lowstab.m_backend.data._M_elems._32_5_ = SUB85(uVar6,0);
        lowstab.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        lowstab.m_backend.data._M_elems._0_16_ =
             *(undefined1 (*) [16])(local_4f8->m_backend).data._M_elems;
        lowstab.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((local_4f8->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((local_4f8->m_backend).data._M_elems + 6);
        lowstab.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
        lowstab.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        lowstab.m_backend.exp =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .delta.m_backend.exp;
        lowstab.m_backend.neg =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .delta.m_backend.neg;
        lowstab.m_backend.fpclass =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .delta.m_backend.fpclass;
        lowstab.m_backend.prec_elem =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .delta.m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&lowstab.m_backend,&result_2.m_backend);
      bVar23 = true;
      if ((result.m_backend.fpclass != cpp_dec_float_NaN) &&
         (lowstab.m_backend.fpclass != cpp_dec_float_NaN)) {
        iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&result.m_backend,&lowstab.m_backend);
        bVar23 = iVar24 < 1;
      }
    }
    else {
      pnVar29 = local_5a8;
      if (result_1.m_backend.fpclass != cpp_dec_float_NaN) {
        lowstab.m_backend.fpclass = cpp_dec_float_finite;
        lowstab.m_backend.prec_elem = 10;
        lowstab.m_backend.data._M_elems[0] = 0;
        lowstab.m_backend.data._M_elems[1] = 0;
        lowstab.m_backend.data._M_elems[2] = 0;
        lowstab.m_backend.data._M_elems[3] = 0;
        lowstab.m_backend.data._M_elems[4] = 0;
        lowstab.m_backend.data._M_elems[5] = 0;
        lowstab.m_backend.data._M_elems._24_5_ = 0;
        lowstab.m_backend.data._M_elems[7]._1_3_ = 0;
        lowstab.m_backend.data._M_elems._32_5_ = 0;
        lowstab.m_backend.data._M_elems[9]._1_3_ = 0;
        lowstab.m_backend.exp = 0;
        lowstab.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&lowstab.m_backend,0.0);
        iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&result_1.m_backend,&lowstab.m_backend);
        pnVar29 = local_5a8;
        if (0 < iVar25) {
          pnVar29 = local_590;
        }
      }
      result.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar29[iVar24].m_backend.data._M_elems + 8);
      pnVar27 = pnVar29 + iVar24;
      result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar27->m_backend).data._M_elems;
      result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar27->m_backend).data._M_elems + 2)
      ;
      puVar1 = pnVar29[iVar24].m_backend.data._M_elems + 4;
      result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      result.m_backend.exp = pnVar29[iVar24].m_backend.exp;
      result.m_backend.neg = pnVar29[iVar24].m_backend.neg;
      result.m_backend.fpclass = pnVar29[iVar24].m_backend.fpclass;
      result.m_backend.prec_elem = pnVar29[iVar24].m_backend.prec_elem;
      local_4a8._0_4_ = cpp_dec_float_finite;
      local_4a8._4_4_ = 10;
      local_4d8 = ZEXT816(0);
      local_4c8[0] = 0;
      local_4c8[1] = 0;
      stack0xfffffffffffffb40 = 0;
      uStack_4bb = 0;
      _local_4b8 = 0;
      uStack_4b3 = 0;
      local_4b0 = 0;
      local_4ac = false;
      if ((cpp_dec_float<50U,_int,_void> *)local_4d8 == &local_588[iVar24].m_backend) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)local_4d8,&result.m_backend);
        if (local_4d8._0_4_ != 0 || (fpclass_type)local_4a8 != cpp_dec_float_finite) {
          local_4ac = (bool)(local_4ac ^ 1);
        }
      }
      else {
        _local_4b8 = result.m_backend.data._M_elems._32_5_;
        uStack_4b3 = result.m_backend.data._M_elems[9]._1_3_;
        stack0xfffffffffffffb40 = result.m_backend.data._M_elems._24_5_;
        uStack_4bb = result.m_backend.data._M_elems[7]._1_3_;
        local_4a8._4_4_ = result.m_backend.prec_elem;
        local_4a8._0_4_ = result.m_backend.fpclass;
        local_4d8 = *(undefined1 (*) [16])(pnVar27->m_backend).data._M_elems;
        local_4c8._0_8_ = result.m_backend.data._M_elems._16_8_;
        local_4b0 = result.m_backend.exp;
        local_4ac = result.m_backend.neg;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)local_4d8,&local_588[iVar24].m_backend);
      }
      lowstab.m_backend.fpclass = cpp_dec_float_finite;
      lowstab.m_backend.prec_elem = 10;
      lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      lowstab.m_backend.data._M_elems[4] = 0;
      lowstab.m_backend.data._M_elems[5] = 0;
      lowstab.m_backend.data._M_elems._24_5_ = 0;
      lowstab.m_backend.data._M_elems[7]._1_3_ = 0;
      lowstab.m_backend.data._M_elems._32_5_ = 0;
      lowstab.m_backend.data._M_elems[9]._1_3_ = 0;
      lowstab.m_backend.exp = 0;
      lowstab.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&lowstab.m_backend,(cpp_dec_float<50U,_int,_void> *)local_4d8,&result_1.m_backend);
      this = local_4e8;
      auVar17 = (undefined1  [16])lowstab.m_backend.data._M_elems._0_16_;
      result.m_backend.data._M_elems[9]._1_3_ = lowstab.m_backend.data._M_elems[9]._1_3_;
      result.m_backend.data._M_elems._32_5_ = lowstab.m_backend.data._M_elems._32_5_;
      result.m_backend.data._M_elems[7]._1_3_ = lowstab.m_backend.data._M_elems[7]._1_3_;
      result.m_backend.data._M_elems._24_5_ = lowstab.m_backend.data._M_elems._24_5_;
      result.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
      result.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
      result.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
      result.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
      result.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
      result.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
      result.m_backend.exp = lowstab.m_backend.exp;
      result.m_backend.neg = lowstab.m_backend.neg;
      result.m_backend.fpclass = lowstab.m_backend.fpclass;
      result.m_backend.prec_elem = lowstab.m_backend.prec_elem;
      bVar23 = true;
      lowstab.m_backend.data._M_elems._0_16_ = auVar17;
      if (((lowstab.m_backend.fpclass != cpp_dec_float_NaN) &&
          (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&result.m_backend,&result_2.m_backend), iVar24 < 1)) {
        local_538.neg = result_1.m_backend.neg;
        if (result_1.m_backend.neg == true) {
          local_538.neg =
               result_1.m_backend.fpclass == cpp_dec_float_finite &&
               result_1.m_backend.data._M_elems[0] == 0;
        }
        local_538.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
        local_538.data._M_elems[9] = result_1.m_backend.data._M_elems[9];
        local_538.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
        local_538.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
        local_538.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
        local_538.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
        local_538.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
        local_538.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
        local_538.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
        local_538.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
        local_538.exp = result_1.m_backend.exp;
        local_538.fpclass = result_1.m_backend.fpclass;
        local_538.prec_elem = result_1.m_backend.prec_elem;
        local_598 = (cpp_dec_float<50U,_int,_void> *)CONCAT44(local_598._4_4_,uVar30);
      }
    }
    lVar28 = lVar28 + 0x40;
    lVar26 = lVar26 + 1;
  } while (bVar23);
  u = &(this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).fastDelta.m_backend;
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 10;
  lowstab.m_backend.data._M_elems[0] = 0;
  lowstab.m_backend.data._M_elems[1] = 0;
  lowstab.m_backend.data._M_elems[2] = 0;
  lowstab.m_backend.data._M_elems[3] = 0;
  lowstab.m_backend.data._M_elems[4] = 0;
  lowstab.m_backend.data._M_elems[5] = 0;
  lowstab.m_backend.data._M_elems._24_5_ = 0;
  lowstab.m_backend.data._M_elems[7]._1_3_ = 0;
  lowstab.m_backend.data._M_elems._32_5_ = 0;
  lowstab.m_backend.data._M_elems[9]._1_3_ = 0;
  lowstab.m_backend.exp = 0;
  lowstab.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&lowstab.m_backend,u,&local_538);
  local_418[9]._1_3_ = lowstab.m_backend.data._M_elems[9]._1_3_;
  local_418._32_5_ = lowstab.m_backend.data._M_elems._32_5_;
  local_418[7]._1_3_ = lowstab.m_backend.data._M_elems[7]._1_3_;
  local_418._24_5_ = lowstab.m_backend.data._M_elems._24_5_;
  local_418[4] = lowstab.m_backend.data._M_elems[4];
  local_418[5] = lowstab.m_backend.data._M_elems[5];
  local_418[0] = lowstab.m_backend.data._M_elems[0];
  local_418[1] = lowstab.m_backend.data._M_elems[1];
  local_418[2] = lowstab.m_backend.data._M_elems[2];
  local_418[3] = lowstab.m_backend.data._M_elems[3];
  local_644 = lowstab.m_backend.exp;
  local_4f8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)CONCAT71(local_4f8._1_7_,lowstab.m_backend.neg);
  local_57c = lowstab.m_backend.fpclass;
  local_580 = lowstab.m_backend.prec_elem;
  bVar23 = ((this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver)->instableEnter;
  peVar10 = (this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  dVar2 = peVar10->s_epsilon_multiplier;
  uVar31 = -(ulong)(dVar2 == 1.0);
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 10;
  lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems[4] = 0;
  lowstab.m_backend.data._M_elems[5] = 0;
  lowstab.m_backend.data._M_elems._24_5_ = 0;
  lowstab.m_backend.data._M_elems[7]._1_3_ = 0;
  lowstab.m_backend.data._M_elems._32_5_ = 0;
  lowstab.m_backend.data._M_elems[9]._1_3_ = 0;
  lowstab.m_backend.exp = 0;
  lowstab.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&lowstab,
             (double)(~uVar31 & (ulong)(dVar2 * 1e-10) | uVar31 & 0x3ddb7cdfd9d7bdbb));
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  auVar17 = (undefined1  [16])lowstab.m_backend.data._M_elems._0_16_;
  if (bVar23 == false) {
    local_e8.m_backend.data._M_elems[9] = local_538.data._M_elems[9];
    local_e8.m_backend.data._M_elems[8] = local_538.data._M_elems[8];
    local_e8.m_backend.data._M_elems[1] = local_538.data._M_elems[1];
    local_e8.m_backend.data._M_elems[0] = local_538.data._M_elems[0];
    local_e8.m_backend.data._M_elems[3] = local_538.data._M_elems[3];
    local_e8.m_backend.data._M_elems[2] = local_538.data._M_elems[2];
    local_e8.m_backend.data._M_elems[5] = local_538.data._M_elems[5];
    local_e8.m_backend.data._M_elems[4] = local_538.data._M_elems[4];
    local_e8.m_backend.data._M_elems[7] = local_538.data._M_elems[7];
    local_e8.m_backend.data._M_elems[6] = local_538.data._M_elems[6];
    local_e8.m_backend.exp = local_538.exp;
    local_e8.m_backend.neg = local_538.neg;
    local_e8.m_backend.fpclass = local_538.fpclass;
    local_e8.m_backend.prec_elem = local_538.prec_elem;
    SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::minStability(&result,&this->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,&local_e8);
  }
  else {
    result.m_backend.data._M_elems[9]._1_3_ = lowstab.m_backend.data._M_elems[9]._1_3_;
    result.m_backend.data._M_elems._32_5_ = lowstab.m_backend.data._M_elems._32_5_;
    result.m_backend.data._M_elems[7]._1_3_ = lowstab.m_backend.data._M_elems[7]._1_3_;
    result.m_backend.data._M_elems._24_5_ = lowstab.m_backend.data._M_elems._24_5_;
    result.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
    result.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
    result.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
    result.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
    result.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
    result.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
    result.m_backend.exp = lowstab.m_backend.exp;
    result.m_backend.neg = lowstab.m_backend.neg;
    result.m_backend.fpclass = lowstab.m_backend.fpclass;
    result.m_backend.prec_elem = lowstab.m_backend.prec_elem;
    lowstab.m_backend.data._M_elems._0_16_ = auVar17;
  }
  pcVar21 = local_598;
  local_348.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
  local_348.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
  local_348.data._M_elems[4] = result.m_backend.data._M_elems[4];
  local_348.data._M_elems[5] = result.m_backend.data._M_elems[5];
  local_348.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
  local_348.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
  local_348.data._M_elems[0] = result.m_backend.data._M_elems[0];
  local_348.data._M_elems[1] = result.m_backend.data._M_elems[1];
  local_348.data._M_elems[2] = result.m_backend.data._M_elems[2];
  local_348.data._M_elems[3] = result.m_backend.data._M_elems[3];
  local_348.exp = result.m_backend.exp;
  local_348.neg = result.m_backend.neg;
  local_348.fpclass = result.m_backend.fpclass;
  local_348.prec_elem = result.m_backend.prec_elem;
  if ((int)local_598 < 0) {
    bVar23 = false;
    uVar30 = local_648;
    local_598 = u;
    if (-1 < (int)local_648) {
      do {
        iVar24 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_648].idx;
        if (-1 < iVar24) {
          local_258.m_backend.data._M_elems[9] = local_538.data._M_elems[9];
          local_258.m_backend.data._M_elems[8] = local_538.data._M_elems[8];
          local_258.m_backend.data._M_elems[1] = local_538.data._M_elems[1];
          local_258.m_backend.data._M_elems[0] = local_538.data._M_elems[0];
          local_258.m_backend.data._M_elems[3] = local_538.data._M_elems[3];
          local_258.m_backend.data._M_elems[2] = local_538.data._M_elems[2];
          local_258.m_backend.data._M_elems[5] = local_538.data._M_elems[5];
          local_258.m_backend.data._M_elems[4] = local_538.data._M_elems[4];
          local_258.m_backend.data._M_elems[7] = local_538.data._M_elems[7];
          local_258.m_backend.data._M_elems[6] = local_538.data._M_elems[6];
          local_258.m_backend.exp = local_538.exp;
          local_258.m_backend.neg = local_538.neg;
          local_258.m_backend.fpclass = local_538.fpclass;
          local_258.m_backend.prec_elem = local_538.prec_elem;
          local_2d8.m_backend.data._M_elems[0] = local_418[0];
          local_2d8.m_backend.data._M_elems[1] = local_418[1];
          local_2d8.m_backend.data._M_elems[2] = local_418[2];
          local_2d8.m_backend.data._M_elems[3] = local_418[3];
          local_2d8.m_backend.data._M_elems[4] = local_418[4];
          local_2d8.m_backend.data._M_elems[5] = local_418[5];
          local_2d8.m_backend.data._M_elems[6] = local_418[6];
          local_2d8.m_backend.data._M_elems[7] = local_418[7];
          local_2d8.m_backend.data._M_elems[8] = local_418[8];
          local_2d8.m_backend.data._M_elems[9] = local_418[9];
          local_2d8.m_backend.exp = local_644;
          local_2d8.m_backend.neg = (bool)local_4f8._0_1_;
          local_2d8.m_backend.fpclass = local_57c;
          local_2d8.m_backend.prec_elem = local_580;
          local_298.m_backend.data._M_elems[0] = local_578.data._M_elems[0];
          local_298.m_backend.data._M_elems[1] = local_578.data._M_elems[1];
          local_298.m_backend.data._M_elems[2] = local_578.data._M_elems[2];
          local_298.m_backend.data._M_elems[3] = local_578.data._M_elems[3];
          local_298.m_backend.data._M_elems[4] = local_578.data._M_elems[4];
          local_298.m_backend.data._M_elems[5] = local_578.data._M_elems[5];
          local_298.m_backend.data._M_elems[6] = local_578.data._M_elems[6];
          local_298.m_backend.data._M_elems[7] = local_578.data._M_elems[7];
          local_298.m_backend.data._M_elems[8] = local_578.data._M_elems[8];
          local_298.m_backend.data._M_elems[9] = local_578.data._M_elems[9];
          local_298.m_backend.exp = local_578.exp;
          local_298.m_backend.neg = local_578.neg;
          local_298.m_backend.fpclass = local_578.fpclass;
          local_298.m_backend.prec_elem = local_578.prec_elem;
          bVar23 = getData(this,val,&leaveIdx,iVar24,&local_258,&local_2d8,local_5a0,local_588,
                           local_5a8,local_590,FVEC,&local_298);
        }
        uVar30 = local_648 - 1;
      } while ((bVar23 == false) && (bVar11 = 0 < (int)local_648, local_648 = uVar30, bVar11));
    }
    local_648 = uVar30 + 1;
    u = local_598;
  }
  else {
    if ((result.m_backend.fpclass == cpp_dec_float_NaN || local_538.fpclass == cpp_dec_float_NaN) ||
       (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_538,&local_348), iVar24 < 1)) goto LAB_002e0737;
    local_128.m_backend.data._M_elems[9] = local_538.data._M_elems[9];
    local_128.m_backend.data._M_elems[8] = local_538.data._M_elems[8];
    local_128.m_backend.data._M_elems[1] = local_538.data._M_elems[1];
    local_128.m_backend.data._M_elems[0] = local_538.data._M_elems[0];
    local_128.m_backend.data._M_elems[3] = local_538.data._M_elems[3];
    local_128.m_backend.data._M_elems[2] = local_538.data._M_elems[2];
    local_128.m_backend.data._M_elems[5] = local_538.data._M_elems[5];
    local_128.m_backend.data._M_elems[4] = local_538.data._M_elems[4];
    local_128.m_backend.data._M_elems[7] = local_538.data._M_elems[7];
    local_128.m_backend.data._M_elems[6] = local_538.data._M_elems[6];
    local_128.m_backend.exp = local_538.exp;
    local_128.m_backend.neg = local_538.neg;
    local_128.m_backend.fpclass = local_538.fpclass;
    local_128.m_backend.prec_elem = local_538.prec_elem;
    local_168.m_backend.data._M_elems[0] = local_418[0];
    local_168.m_backend.data._M_elems[1] = local_418[1];
    local_168.m_backend.data._M_elems[2] = local_418[2];
    local_168.m_backend.data._M_elems[3] = local_418[3];
    local_168.m_backend.data._M_elems[4] = local_418[4];
    local_168.m_backend.data._M_elems[5] = local_418[5];
    local_168.m_backend.data._M_elems[6] = local_418[6];
    local_168.m_backend.data._M_elems[7] = local_418[7];
    local_168.m_backend.data._M_elems[8] = local_418[8];
    local_168.m_backend.data._M_elems[9] = local_418[9];
    local_168.m_backend.exp = local_644;
    local_168.m_backend.neg = (bool)local_4f8._0_1_;
    local_168.m_backend.fpclass = local_57c;
    local_168.m_backend.prec_elem = local_580;
    local_1a8.m_backend.data._M_elems[0] = local_578.data._M_elems[0];
    local_1a8.m_backend.data._M_elems[1] = local_578.data._M_elems[1];
    local_1a8.m_backend.data._M_elems[2] = local_578.data._M_elems[2];
    local_1a8.m_backend.data._M_elems[3] = local_578.data._M_elems[3];
    local_1a8.m_backend.data._M_elems[4] = local_578.data._M_elems[4];
    local_1a8.m_backend.data._M_elems[5] = local_578.data._M_elems[5];
    local_1a8.m_backend.data._M_elems[6] = local_578.data._M_elems[6];
    local_1a8.m_backend.data._M_elems[7] = local_578.data._M_elems[7];
    local_1a8.m_backend.data._M_elems[8] = local_578.data._M_elems[8];
    local_1a8.m_backend.data._M_elems[9] = local_578.data._M_elems[9];
    local_1a8.m_backend.exp = local_578.exp;
    local_1a8.m_backend.neg = local_578.neg;
    local_1a8.m_backend.fpclass = local_578.fpclass;
    local_1a8.m_backend.prec_elem = local_578.prec_elem;
    bVar23 = getData(this,val,&leaveIdx,
                     (this->breakpoints).data.
                     super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                     ._M_impl.super__Vector_impl_data._M_start[(ulong)pcVar21 & 0xffffffff].idx,
                     &local_128,&local_168,local_5a0,local_588,local_5a8,local_590,FVEC,&local_1a8);
  }
  if (bVar23 == false) {
LAB_002e0737:
    if (this->relax_count < 2) {
      SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::relax(&this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
      this->relax_count = this->relax_count + 1;
      *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_578.data._M_elems._32_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_578.data._M_elems._16_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_578.data._M_elems._24_8_;
      *(undefined8 *)(val->m_backend).data._M_elems = local_578.data._M_elems._0_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_578.data._M_elems._8_8_;
      (val->m_backend).exp = local_578.exp;
      (val->m_backend).neg = local_578.neg;
      (val->m_backend).fpclass = local_578.fpclass;
      (val->m_backend).prec_elem = local_578.prec_elem;
      local_1e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((enterTest->m_backend).data._M_elems + 8);
      local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterTest->m_backend).data._M_elems;
      local_1e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((enterTest->m_backend).data._M_elems + 2);
      local_1e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((enterTest->m_backend).data._M_elems + 4);
      local_1e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((enterTest->m_backend).data._M_elems + 6);
      local_1e8.m_backend.exp = (enterTest->m_backend).exp;
      local_1e8.m_backend.neg = (enterTest->m_backend).neg;
      local_1e8.m_backend.fpclass = (enterTest->m_backend).fpclass;
      local_1e8.m_backend.prec_elem = (enterTest->m_backend).prec_elem;
      leaveIdx = selectLeave(this,val,&local_1e8,false);
    }
    return leaveIdx;
  }
  this->relax_count = 0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tighten(&this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           );
  pcVar21 = local_4f0;
  lVar26 = (long)(int)local_648;
  if (0 < lVar26) {
    pBVar5 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    result.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 0x20);
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pBVar5[lVar26].val.m_backend;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 8);
    puVar1 = (uint *)((long)&pBVar5[lVar26].val.m_backend + 0x10);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    result.m_backend.exp = *(int *)((long)&pBVar5[lVar26].val.m_backend + 0x28);
    result.m_backend.neg = *(bool *)((long)&pBVar5[lVar26].val.m_backend + 0x2c);
    result.m_backend._48_8_ = *(undefined8 *)((long)&pBVar5[lVar26].val.m_backend + 0x30);
    if ((result.m_backend.neg == true) &&
       (result.m_backend.data._M_elems[0] != 0 || result.m_backend.fpclass != cpp_dec_float_finite))
    {
      result.m_backend.neg = false;
    }
    local_218 = (uint  [2])result.m_backend.data._M_elems._0_8_;
    auStack_210 = (uint  [2])result.m_backend.data._M_elems._8_8_;
    local_208 = (uint  [2])result.m_backend.data._M_elems._16_8_;
    auStack_200 = (uint  [2])result.m_backend.data._M_elems._24_8_;
    local_1f8._0_8_ = result.m_backend.data._M_elems._32_8_;
    if (((result.m_backend.fpclass != cpp_dec_float_NaN) &&
        ((this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).fastDelta.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&result.m_backend,u), 0 < iVar24)) {
      flipAndUpdate(this,(int *)&local_648);
      ((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .thesolver)->boundflips = local_648;
      if (9 < (int)local_648) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(pcVar21,1);
        return leaveIdx;
      }
      result.m_backend.data._M_elems[0] = 0x9999999a;
      result.m_backend.data._M_elems[1] = 0x3fa99999;
      goto LAB_002e08af;
    }
  }
  ((this->
   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).
   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .thesolver)->boundflips = 0;
  result.m_backend.data._M_elems[0] = 0x9999999a;
  result.m_backend.data._M_elems[1] = 0x3fb99999;
LAB_002e08af:
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
  ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                *)pcVar21,(double *)&result);
  return leaveIdx;
}

Assistant:

int SPxBoundFlippingRT<R>::selectLeave(
   R&                 val,
   R                  enterTest,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::ENTER);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->enterCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DEBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(polish || !enableBoundFlips || !enableRowBoundFlips
         || this->thesolver->rep() == SPxSolverBase<R>::COLUMN || flipPotential <= 0)
   {
      SPxOut::debug(this, "DEBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectLeave(val, enterTest, polish);
   }

   const R*  vec =
      this->thesolver->fVec().get_const_ptr();         /**< pointer to values of current VectorBase<R> */
   const R*  upd =
      this->thesolver->fVec().delta().values();        /**< pointer to update values of current VectorBase<R> */
   const int*   idx =
      this->thesolver->fVec().delta().indexMem();      /**< pointer to indices of current VectorBase<R> */
   int          updnnz =
      this->thesolver->fVec().delta().size();       /**< number of nonzeros in update VectorBase<R> */
   const R*  lb  =
      this->thesolver->lbBound().get_const_ptr();      /**< pointer to lower bound/lhs of current VectorBase<R> */
   const R*  ub  =
      this->thesolver->ubBound().get_const_ptr();      /**< pointer to upper bound/rhs of current VectorBase<R> */

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid leaving index
   int leaveIdx = -1;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   assert(this->thesolver->fVec().delta().isSetup());

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }

   // return -1 if no BP was found
   if(nBp == 0)
   {
      val = max;
      return leaveIdx;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(enterTest);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableEnterId.isValid());
      // restore original slope
      slope = this->thesolver->instableEnterVal;
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      assert(breakpoints[npassedBp].src == FVEC);
      int breakpointidx = breakpoints[npassedBp].idx;
      // compute new slope
      R upper;
      R lower;
      R absupd = spxAbs(upd[breakpointidx]);
      SPxId baseId = this->thesolver->baseId(breakpointidx);
      int i = this->thesolver->number(baseId);

      if(baseId.isSPxColId())
      {
         upper = this->thesolver->upper(i);
         lower = this->thesolver->lower(i);
      }
      else
      {
         assert(baseId.isSPxRowId());
         upper = this->thesolver->rhs(i);
         lower = this->thesolver->lhs(i);
      }

      slope -= (upper * absupd) - (lower * absupd);

      // get most stable pivot
      if(absupd > moststable)
         moststable = absupd;
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DEBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectLeave(val, enterTest);
   }

   SPxOut::debug(this, "DEBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int breakpointidx = breakpoints[stableBp].idx;
      assert(breakpoints[stableBp].src == FVEC);
      R x = upd[breakpointidx];

      if(spxAbs(x) > moststable)
      {
         stableDelta = (x > 0.0) ? ub[breakpointidx] : lb[breakpointidx];
         stableDelta = (stableDelta - vec[breakpointidx]) / x;

         if(stableDelta <= bestDelta)
         {
            moststable = spxAbs(x);
            bestBp = stableBp;
         }
      }
      // stop searching if the step length is too big
      else if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableEnter;
   assert(!instable || this->thesolver->instableEnterId.isValid());
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int breakpointidx = breakpoints[bestBp].idx;
         assert(breakpointidx >= 0);
         foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                               max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int breakpointidx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(breakpointidx >= 0)
         {
            foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                                  max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(leaveIdx < 0);

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DEBFRT04 {}: no valid leaveIdx found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectLeave(val, enterTest);
      }
      else
      {
         SPxOut::debug(this, "DEBFRT05 {}: no valid leaveIdx found - breaking...\n",
                       this->thesolver->basis().iteration());
         return leaveIdx;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DEBFRT06 {}: selected Index: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), leaveIdx, nBp);

   return leaveIdx;
}